

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O1

void lib::table::RegisterLibTable(State *state)

{
  Library lib;
  TableMemberReg table [5];
  Library LStack_98;
  TableMemberReg local_88;
  char *local_70;
  code *local_68;
  undefined4 local_60;
  char *local_58;
  code *local_50;
  undefined4 local_48;
  char *local_40;
  code *local_38;
  undefined4 local_30;
  char *local_28;
  code *local_20;
  undefined4 local_18;
  
  luna::Library::Library(&LStack_98,state);
  local_88.name_ = "concat";
  local_88.field_1.func_ = Concat;
  local_88.type_ = ValueT_CFunction;
  local_70 = "insert";
  local_68 = Insert;
  local_60 = 9;
  local_58 = "pack";
  local_50 = Pack;
  local_48 = 9;
  local_40 = "remove";
  local_38 = Remove;
  local_30 = 9;
  local_28 = "unpack";
  local_20 = Unpack;
  local_18 = 9;
  luna::Library::RegisterTableFunction(&LStack_98,"table",&local_88,5);
  return;
}

Assistant:

void RegisterLibTable(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg table[] = {
            { "concat", Concat },
            { "insert", Insert },
            { "pack", Pack },
            { "remove", Remove },
            { "unpack", Unpack }
        };

        lib.RegisterTableFunction("table", table);
    }